

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_LimitingInputStream_Test::TestBody
          (IoTest_LimitingInputStream_Test *this)

{
  int64_t limit;
  bool read_eof;
  ZeroCopyOutputStream *output_00;
  LimitingInputStream input;
  ArrayInputStream array_input;
  ArrayOutputStream output;
  uint8_t buffer [256];
  LimitingInputStream LStack_178;
  ArrayInputStream local_158;
  ArrayOutputStream local_138;
  ZeroCopyOutputStream local_118 [32];
  
  output_00 = local_118;
  ArrayOutputStream::ArrayOutputStream(&local_138,local_118,0x100,-1);
  IoTest::WriteStuff((IoTest *)&local_138,output_00);
  ArrayInputStream::ArrayInputStream(&local_158,local_118,0x100,-1);
  limit = ArrayOutputStream::ByteCount(&local_138);
  LimitingInputStream::LimitingInputStream(&LStack_178,&local_158.super_ZeroCopyInputStream,limit);
  IoTest::ReadStuff((IoTest *)&LStack_178,(ZeroCopyInputStream *)0x1,read_eof);
  LimitingInputStream::~LimitingInputStream(&LStack_178);
  return;
}

Assistant:

TEST_F(IoTest, LimitingInputStream) {
  const int kBufferSize = 256;
  uint8_t buffer[kBufferSize];

  // Fill the buffer.
  ArrayOutputStream output(buffer, kBufferSize);
  WriteStuff(&output);

  // Set up input.
  ArrayInputStream array_input(buffer, kBufferSize);
  LimitingInputStream input(&array_input, output.ByteCount());

  ReadStuff(&input);
}